

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockActiveVariablesTestCase::iterate
          (InterfaceBlockActiveVariablesTestCase *this)

{
  ostringstream *poVar1;
  Storage SVar2;
  RenderContext *renderCtx;
  TestLog *pTVar3;
  Shader *pSVar4;
  GLint GVar5;
  GLint aGVar6 [2];
  __type_conflict _Var7;
  bool bVar8;
  undefined4 uVar9;
  int iVar10;
  deUint32 dVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar12;
  undefined4 extraout_var_01;
  InternalError *this_00;
  long lVar13;
  Program *pPVar14;
  char *pcVar15;
  char *nameWithPath;
  InterfaceBlock *interfaceBlock;
  bool bVar16;
  Functional *this_01;
  undefined4 uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int varNdx;
  size_type __new_size;
  long lVar21;
  GLint written_1;
  GLint written;
  undefined4 uStack_334;
  undefined4 local_330;
  GLint nameLength;
  GLenum props [1];
  undefined4 uStack_324;
  int local_304;
  GLint retBuffer [2];
  pointer local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  activeResourceNames;
  ScopedLogSection section;
  GLenum nameProp;
  ulong local_2a8;
  long local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockNames;
  MessageBuilder builder;
  ShaderProgram program;
  
  SVar2 = (this->super_InterfaceBlockBaseCase).m_storage;
  uVar17 = 0x92e5;
  if (SVar2 != STORAGE_BUFFER) {
    uVar17 = 0;
  }
  pPVar14 = (Program *)&DAT_00000001;
  if (SVar2 != STORAGE_UNIFORM) {
    pPVar14 = (Program *)(ulong)((SVar2 != STORAGE_BUFFER) + 7);
  }
  local_330 = *(undefined4 *)
               (Functional::(anonymous_namespace)::
                getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
               (long)pPVar14 * 4);
  uVar9 = 0x92e1;
  if (SVar2 != STORAGE_UNIFORM) {
    uVar9 = uVar17;
  }
  getProgramInterfaceResourceList_abi_cxx11_
            (&blockNames,(Functional *)(this->super_InterfaceBlockBaseCase).m_program,pPVar14,
             PROGRAMINTERFACE_UNIFORM);
  renderCtx = ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&builder,(this->super_InterfaceBlockBaseCase).m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&builder);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&builder);
  tcu::TestContext::setTestResult
            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pPVar14 = (this->super_InterfaceBlockBaseCase).m_program;
  iVar10 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  checkAndLogProgram(&program,pPVar14,(Functions *)CONCAT44(extraout_var,iVar10),
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  lVar13 = 0;
  local_304 = 0;
  do {
    if ((int)((ulong)((long)blockNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)blockNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar13) {
      pTVar3 = ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxNumActiveVariables",(allocator<char> *)props);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)retBuffer,"MAX_NUM_ACTIVE_VARIABLES",(allocator<char> *)&section);
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&activeResourceNames,pTVar3,(string *)&builder,
                 (string *)retBuffer);
      std::__cxx11::string::~string((string *)retBuffer);
      std::__cxx11::string::~string((string *)&builder);
      iVar10 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
                 _vptr_RenderContext[3])();
      retBuffer[0] = -1;
      (**(code **)(CONCAT44(extraout_var_01,iVar10) + 0x990))
                (program.m_program.m_program,local_330,0x92f7);
      dVar11 = (**(code **)(CONCAT44(extraout_var_01,iVar10) + 0x800))();
      glu::checkError(dVar11,"query MAX_NUM_ACTIVE_VARIABLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x7fe);
      builder.m_log =
           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = &builder.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "MAX_NUM_ACTIVE_VARIABLES = ");
      std::ostream::operator<<(poVar1,retBuffer[0]);
      tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      if (local_304 == retBuffer[0]) {
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = &builder.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "MAX_NUM_ACTIVE_VARIABLES valid");
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      else {
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = &builder.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Error, got unexpected MAX_NUM_ACTIVE_VARIABLES");
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,"unexpected MAX_NUM_ACTIVE_VARIABLES");
      }
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&activeResourceNames);
      glu::ShaderProgram::~ShaderProgram(&program);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&blockNames);
      return STOP;
    }
    pTVar3 = ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_2a0 = lVar13;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"Block",(allocator<char> *)props);
    lVar13 = local_2a0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &activeResourceNames,"Block \"",
                   blockNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_2a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)retBuffer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &activeResourceNames,"\"");
    tcu::ScopedLogSection::ScopedLogSection
              (&section,pTVar3,(string *)&builder,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)retBuffer);
    std::__cxx11::string::~string((string *)retBuffer);
    std::__cxx11::string::~string((string *)&activeResourceNames);
    std::__cxx11::string::~string((string *)&builder);
    iVar10 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[3])();
    lVar19 = CONCAT44(extraout_var_00,iVar10);
    iVar10 = (**(code **)(lVar19 + 0x9a8))
                       (program.m_program.m_program,local_330,
                        blockNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus._M_p);
    activeResourceNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    activeResourceNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    activeResourceNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dVar11 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar11,"query resource index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x72c);
    if (iVar10 == -1) {
      builder.m_log =
           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = &builder.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)
                      (blockNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13));
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\"");
      tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      tcu::TestContext::setTestResult
                ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Resource not found");
    }
    else {
      retBuffer[0] = -1;
      retBuffer[1] = -1;
      written = 0xffffffff;
      _props = (pointer)CONCAT44(uStack_324,0x9304);
      (**(code **)(lVar19 + 0x9c8))(program.m_program.m_program,local_330,iVar10,1,props,1,&written)
      ;
      dVar11 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar11,"query GL_NUM_ACTIVE_VARIABLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x73d);
      aGVar6 = retBuffer;
      GVar5 = retBuffer[0];
      __new_size = (size_type)retBuffer[0];
      if (local_304 <= retBuffer[0]) {
        local_304 = retBuffer[0];
      }
      builder.m_log =
           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
      std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                      "NUM_ACTIVE_VARIABLES = ");
      std::ostream::operator<<(&builder.m_str,GVar5);
      tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
      if (retBuffer[0] == -1 || written == -1) {
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
        std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                        "Error, Query for NUM_ACTIVE_VARIABLES did not return a value");
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
        pcVar15 = "Query for NUM_ACTIVE_VARIABLES failed";
      }
      else if (retBuffer[1] == -1) {
        if (-1 < retBuffer[0]) {
          written = 0x9305;
          builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0xffffffff);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)retBuffer,(long)(GVar5 + 1),
                     (value_type_conflict1 *)&builder,(allocator_type *)props);
          written_1 = -1;
          (**(code **)(lVar19 + 0x9c8))
                    (program.m_program.m_program,local_330,iVar10,1,&written,
                     (ulong)((long)local_2f8 - (long)retBuffer) >> 2,&written_1);
          dVar11 = (**(code **)(lVar19 + 0x800))();
          glu::checkError(dVar11,"query GL_ACTIVE_VARIABLES",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                          ,0x75f);
          if (written_1 == -1) {
            builder.m_log =
                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            poVar1 = &builder.m_str;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            "Error, Query for GL_ACTIVE_VARIABLES did not return any values");
            tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            pcVar15 = "Query for GL_ACTIVE_VARIABLES failed";
          }
          else if (written_1 == GVar5) {
            if (local_2f8[-1] == -1) {
              builder.m_log =
                   ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
              std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                              "Active variable indices: {");
              local_2a8 = 0;
              if (0 < GVar5) {
                local_2a8 = (ulong)aGVar6 & 0xffffffff;
              }
              lVar21 = local_2a8 * 4;
              for (lVar18 = 0; lVar21 - lVar18 != 0; lVar18 = lVar18 + 4) {
                if (lVar18 != 0) {
                  std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                  ", ");
                }
                tcu::MessageBuilder::operator<<(&builder,(int *)((long)retBuffer + lVar18));
              }
              std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,"}")
              ;
              tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::resize(&activeResourceNames,__new_size);
              lVar21 = 0;
              for (uVar20 = 0; local_2a8 != uVar20; uVar20 = uVar20 + 1) {
                nameLength = -1;
                nameProp = 0x92f9;
                _props = (pointer)0x0;
                written_1 = -1;
                (**(code **)(lVar19 + 0x9c8))
                          (program.m_program.m_program,uVar9,
                           *(undefined4 *)((long)retBuffer + uVar20 * 4),1,&nameProp,1,&written_1);
                dVar11 = (**(code **)(lVar19 + 0x800))();
                glu::checkError(dVar11,"query GL_NAME_LENGTH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                                ,0x78e);
                if ((nameLength < 1) || (written_1 < 1)) {
                  builder.m_log =
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                  std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "Error, GL_NAME_LENGTH query failed");
                  tcu::MessageBuilder::operator<<
                            (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                  pcVar15 = "GL_NAME_LENGTH query failed";
LAB_012f1c88:
                  tcu::TestContext::setTestResult
                            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar15);
                }
                else {
                  builder.m_log = (TestLog *)CONCAT71(builder.m_log._1_7_,0x58);
                  std::vector<char,_std::allocator<char>_>::resize
                            ((vector<char,_std::allocator<char>_> *)props,(long)(nameLength + 2),
                             (value_type *)&builder);
                  written_1 = -1;
                  (**(code **)(lVar19 + 0x9c0))
                            (program.m_program.m_program,uVar9,
                             *(undefined4 *)((long)retBuffer + uVar20 * 4),nameLength + 1,&written_1
                             ,_props);
                  dVar11 = (**(code **)(lVar19 + 0x800))();
                  glu::checkError(dVar11,"getProgramResourceName",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                                  ,0x79a);
                  if ((long)written_1 < 1) {
                    builder.m_log =
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                    std::operator<<(&builder.m_str.
                                     super_basic_ostream<char,_std::char_traits<char>_>,
                                    "Error, name query failed, no data written");
                    tcu::MessageBuilder::operator<<
                              (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_012f1c74:
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                    pcVar15 = "name query failed";
                    goto LAB_012f1c88;
                  }
                  if (nameLength < written_1) {
                    builder.m_log =
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                    std::operator<<(&builder.m_str.
                                     super_basic_ostream<char,_std::char_traits<char>_>,
                                    "Error, name query failed, query returned too much data");
                    tcu::MessageBuilder::operator<<
                              (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    goto LAB_012f1c74;
                  }
                  builder.m_log =
                       (TestLog *)
                       &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&builder,_props,
                             (long)&(_props->_M_dataplus)._M_p + (long)written_1);
                  std::__cxx11::string::operator=
                            ((string *)
                             ((long)&((activeResourceNames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar21),(string *)&builder);
                  std::__cxx11::string::~string((string *)&builder);
                }
                std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                          ((_Vector_base<char,_std::allocator<char>_> *)props);
                lVar21 = lVar21 + 0x20;
              }
              builder.m_log =
                   ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
              std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                              "Active variables:\n");
              lVar19 = local_2a8 << 5;
              for (lVar21 = 0; lVar19 != lVar21; lVar21 = lVar21 + 0x20) {
                poVar1 = &builder.m_str;
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                (string *)
                                ((long)&((activeResourceNames.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar21));
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
              }
              tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)retBuffer);
              glu::parseVariableName_abi_cxx11_
                        ((string *)retBuffer,
                         (glu *)blockNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus._M_p,
                         nameWithPath);
              _props = (pointer)0x0;
              lVar21 = 0x90;
              lVar13 = -1;
              lVar19 = 0x20;
              do {
                pvVar12 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_InterfaceBlockBaseCase).m_program);
                pSVar4 = *(pvVar12->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar13 = lVar13 + 1;
                if ((int)(((long)(pSVar4->m_defaultBlock).interfaceBlocks.
                                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          *(long *)&(pSVar4->m_defaultBlock).interfaceBlocks.
                                    super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                    ._M_impl.super__Vector_impl_data) / 0x90) <= lVar13)
                goto LAB_012f237c;
                pvVar12 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_InterfaceBlockBaseCase).m_program);
                lVar21 = lVar21 + -0x90;
                _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(lVar19 + *(long *)&((*(pvVar12->
                                                                                                                                    
                                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  m_defaultBlock).interfaceBlocks.
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                  ._M_impl.super__Vector_impl_data),
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)retBuffer);
                lVar19 = lVar19 + 0x90;
              } while (!_Var7);
              pvVar12 = ProgramInterfaceDefinition::Program::getShaders
                                  ((this->super_InterfaceBlockBaseCase).m_program);
              this_01 = (Functional *)
                        (*(long *)&((*(pvVar12->
                                      super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                                   interfaceBlocks.
                                   super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                   ._M_impl.super__Vector_impl_data - lVar21);
              if (this_01 == (Functional *)0x0) {
LAB_012f237c:
                this_00 = (InternalError *)__cxa_allocate_exception(0x38);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&builder,
                           "could not find block referenced in the reference resource list",
                           (allocator<char> *)&written);
                tcu::InternalError::InternalError(this_00,(string *)&builder);
                __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
              }
              getProgramInterfaceBlockMemberResourceList_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&builder,this_01,interfaceBlock);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)props,&builder);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&builder);
              builder.m_log =
                   ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
              std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                              "Expected variable names:\n");
              lVar13 = 0;
              for (lVar19 = 0; lVar19 < (int)((ulong)-(long)_props >> 5); lVar19 = lVar19 + 1) {
                poVar1 = &builder.m_str;
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                (string *)((long)&(_props->_M_dataplus)._M_p + lVar13));
                std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
                lVar13 = lVar13 + 0x20;
              }
              tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
              bVar16 = true;
              lVar13 = 0;
              for (lVar19 = 0; lVar19 < (int)((ulong)-(long)_props >> 5); lVar19 = lVar19 + 1) {
                builder.m_log =
                     (TestLog *)
                     activeResourceNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                _written = activeResourceNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                bVar8 = de::
                        contains<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&builder,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&written,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&(_props->_M_dataplus)._M_p + lVar13));
                if (!bVar8) {
                  builder.m_log =
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                  std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "Error, variable name list did not contain active variable ");
                  std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                  (string *)((long)&(_props->_M_dataplus)._M_p + lVar13));
                  tcu::MessageBuilder::operator<<
                            (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                  bVar16 = false;
                }
                lVar13 = lVar13 + 0x20;
              }
              lVar13 = 0;
              for (lVar19 = 0;
                  lVar19 < (int)((ulong)((long)activeResourceNames.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)activeResourceNames.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
                  lVar19 = lVar19 + 1) {
                builder.m_log = (TestLog *)_props;
                _written = (pointer)0x0;
                bVar8 = de::
                        contains<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&builder,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&written,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&((activeResourceNames.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar13));
                if (!bVar8) {
                  builder.m_log =
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
                  poVar1 = &builder.m_str;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "Error, variable name list contains unexpected resource \"");
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  (string *)
                                  ((long)&((activeResourceNames.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar13));
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\"");
                  tcu::MessageBuilder::operator<<
                            (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
                  bVar16 = false;
                }
                lVar13 = lVar13 + 0x20;
              }
              if (bVar16) {
                builder.m_log =
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                "Lists identical");
                tcu::MessageBuilder::operator<<
                          (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
              }
              else {
                builder.m_log =
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                "Error, invalid active variable list");
                tcu::MessageBuilder::operator<<
                          (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                tcu::TestContext::setTestResult
                          ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                           "invalid active variable list");
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)props);
              std::__cxx11::string::~string((string *)retBuffer);
              goto LAB_012f1737;
            }
            builder.m_log =
                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
            std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "Error, GL_ACTIVE_VARIABLES query return buffer trailing guard value was modified, getProgramResourceiv returned more than NUM_ACTIVE_VARIABLES values"
                           );
            tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
            pcVar15 = "Query for GL_ACTIVE_VARIABLES returned too many values";
          }
          else {
            builder.m_log =
                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
            std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                            "Error, Query for GL_ACTIVE_VARIABLES did not return NUM_ACTIVE_VARIABLES values"
                           );
            tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
            pcVar15 = "Query for GL_ACTIVE_VARIABLES returned invalid number of values";
          }
          tcu::TestContext::setTestResult
                    ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar15);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)retBuffer);
          goto LAB_012f1737;
        }
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
        std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                        "Error, NUM_ACTIVE_VARIABLES < 0");
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
        pcVar15 = "NUM_ACTIVE_VARIABLES < 0";
      }
      else {
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
        std::operator<<(&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                        "Error, Query for NUM_ACTIVE_VARIABLES returned too many values");
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
        pcVar15 = "Query for NUM_ACTIVE_VARIABLES returned too many values";
      }
      tcu::TestContext::setTestResult
                ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,pcVar15);
    }
LAB_012f1737:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&activeResourceNames);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar13 = local_2a0 + 1;
  } while( true );
}

Assistant:

InterfaceBlockActiveVariablesTestCase::IterateResult InterfaceBlockActiveVariablesTestCase::iterate (void)
{
	const ProgramInterface			programInterface				= (m_storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																	  (m_storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																	  (PROGRAMINTERFACE_LAST);
	const glw::GLenum				programGLInterfaceValue			= getProgramInterfaceGLEnum(programInterface);
	const glw::GLenum				programMemberInterfaceValue		= (m_storage == glu::STORAGE_UNIFORM) ? (GL_UNIFORM) :
																	  (m_storage == glu::STORAGE_BUFFER) ? (GL_BUFFER_VARIABLE) :
																	  (0);
	const std::vector<std::string>	blockNames						= getProgramInterfaceResourceList(m_program, programInterface);
	glu::ShaderProgram				program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	int								expectedMaxNumActiveVariables	= 0;

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Verify all blocks

	for (int blockNdx = 0; blockNdx < (int)blockNames.size(); ++blockNdx)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "Block", "Block \"" + blockNames[blockNdx] + "\"");
		const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
		const glw::GLuint			resourceNdx			= gl.getProgramResourceIndex(program.getProgram(), programGLInterfaceValue, blockNames[blockNdx].c_str());
		glw::GLint					numActiveResources;
		std::vector<std::string>	activeResourceNames;

		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (resourceNdx == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"" << blockNames[blockNdx] << "\"" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Resource not found");
			continue;
		}

		// query block information

		{
			const glw::GLenum	props[]			= { GL_NUM_ACTIVE_VARIABLES };
			glw::GLint			retBuffer[2]	= { -1, -1 };
			glw::GLint			written			= -1;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, DE_LENGTH_OF_ARRAY(props), props, 1, &written, retBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_NUM_ACTIVE_VARIABLES");

			numActiveResources = retBuffer[0];
			expectedMaxNumActiveVariables = de::max(expectedMaxNumActiveVariables, numActiveResources);
			m_testCtx.getLog() << tcu::TestLog::Message << "NUM_ACTIVE_VARIABLES = " << numActiveResources << tcu::TestLog::EndMessage;

			if (written == -1 || retBuffer[0] == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for NUM_ACTIVE_VARIABLES did not return a value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for NUM_ACTIVE_VARIABLES failed");
				continue;
			}
			else if (retBuffer[1] != -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for NUM_ACTIVE_VARIABLES returned too many values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for NUM_ACTIVE_VARIABLES returned too many values");
				continue;
			}
			else if (retBuffer[0] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, NUM_ACTIVE_VARIABLES < 0" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "NUM_ACTIVE_VARIABLES < 0");
				continue;
			}
		}

		// query block variable information

		{
			const glw::GLenum			props[]					= { GL_ACTIVE_VARIABLES };
			std::vector<glw::GLint>		activeVariableIndices	(numActiveResources + 1, -1);	// Allocate one extra trailing to detect wrong write lengths
			glw::GLint					written					= -1;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, DE_LENGTH_OF_ARRAY(props), props, (glw::GLsizei)activeVariableIndices.size(), &written, &activeVariableIndices[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_ACTIVE_VARIABLES");

			if (written == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for GL_ACTIVE_VARIABLES did not return any values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES failed");
				continue;
			}
			else if (written != numActiveResources)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for GL_ACTIVE_VARIABLES did not return NUM_ACTIVE_VARIABLES values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES returned invalid number of values");
				continue;
			}
			else if (activeVariableIndices.back() != -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, GL_ACTIVE_VARIABLES query return buffer trailing guard value was modified, getProgramResourceiv returned more than NUM_ACTIVE_VARIABLES values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES returned too many values");
				continue;
			}

			// log indices
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Active variable indices: {";
				for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
				{
					if (varNdx)
						builder << ", ";
					builder << activeVariableIndices[varNdx];
				}
				builder << "}" << tcu::TestLog::EndMessage;
			}

			// collect names

			activeResourceNames.resize(numActiveResources);

			for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
			{
				const glw::GLenum	nameProp	= GL_NAME_LENGTH;
				glw::GLint			nameLength	= -1;
				std::vector<char>	nameBuffer;

				written = -1;
				gl.getProgramResourceiv(program.getProgram(), programMemberInterfaceValue, activeVariableIndices[varNdx], 1, &nameProp, 1, &written, &nameLength);
				GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_NAME_LENGTH");

				if (nameLength <= 0 || written <= 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, GL_NAME_LENGTH query failed" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL_NAME_LENGTH query failed");
					continue;
				}

				nameBuffer.resize(nameLength + 2, 'X'); // allocate more than required
				written = -1;
				gl.getProgramResourceName(program.getProgram(), programMemberInterfaceValue, activeVariableIndices[varNdx], nameLength+1, &written, &nameBuffer[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceName");

				if (written <= 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, name query failed, no data written" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "name query failed");
					continue;
				}
				else if (written > nameLength)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, name query failed, query returned too much data" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "name query failed");
					continue;
				}

				activeResourceNames[varNdx] = std::string(&nameBuffer[0], written);
			}

			// log collected names
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Active variables:\n";
				for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
					builder << "\t" << activeResourceNames[varNdx] << "\n";
				builder << tcu::TestLog::EndMessage;
			}
		}

		// verify names
		{
			glu::InterfaceBlock*		block		= DE_NULL;
			const std::string			blockName	= glu::parseVariableName(blockNames[blockNdx].c_str());
			std::vector<std::string>	referenceList;

			for (int interfaceNdx = 0; interfaceNdx < (int)m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks.size(); ++interfaceNdx)
			{
				if (m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks[interfaceNdx].interfaceName == blockName)
				{
					block = &m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks[interfaceNdx];
					break;
				}
			}

			if (!block)
				throw tcu::InternalError("could not find block referenced in the reference resource list");

			// generate reference list

			referenceList = getProgramInterfaceBlockMemberResourceList(*block);
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Expected variable names:\n";
				for (int varNdx = 0; varNdx < (int)referenceList.size(); ++varNdx)
					builder << "\t" << referenceList[varNdx] << "\n";
				builder << tcu::TestLog::EndMessage;
			}

			// compare lists
			{
				bool listsIdentical = true;

				for (int ndx = 0; ndx < (int)referenceList.size(); ++ndx)
				{
					if (!de::contains(activeResourceNames.begin(), activeResourceNames.end(), referenceList[ndx]))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Error, variable name list did not contain active variable " << referenceList[ndx] << tcu::TestLog::EndMessage;
						listsIdentical = false;
					}
				}

				for (int ndx = 0; ndx < (int)activeResourceNames.size(); ++ndx)
				{
					if (!de::contains(referenceList.begin(), referenceList.end(), activeResourceNames[ndx]))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Error, variable name list contains unexpected resource \"" << activeResourceNames[ndx] << "\"" << tcu::TestLog::EndMessage;
						listsIdentical = false;
					}
				}

				if (listsIdentical)
					m_testCtx.getLog() << tcu::TestLog::Message << "Lists identical" << tcu::TestLog::EndMessage;
				else
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, invalid active variable list" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid active variable list");
					continue;
				}
			}
		}
	}

	// Max num active variables
	{
		const tcu::ScopedLogSection	section					(m_testCtx.getLog(), "MaxNumActiveVariables", "MAX_NUM_ACTIVE_VARIABLES");
		const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
		glw::GLint					maxNumActiveVariables	= -1;

		gl.getProgramInterfaceiv(program.getProgram(), programGLInterfaceValue, GL_MAX_NUM_ACTIVE_VARIABLES, &maxNumActiveVariables);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query MAX_NUM_ACTIVE_VARIABLES");

		m_testCtx.getLog() << tcu::TestLog::Message << "MAX_NUM_ACTIVE_VARIABLES = " << maxNumActiveVariables << tcu::TestLog::EndMessage;

		if (expectedMaxNumActiveVariables != maxNumActiveVariables)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected MAX_NUM_ACTIVE_VARIABLES" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected MAX_NUM_ACTIVE_VARIABLES");
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "MAX_NUM_ACTIVE_VARIABLES valid" << tcu::TestLog::EndMessage;
	}

	return STOP;
}